

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

xmlChar * xmlCanonicPath(xmlChar *path)

{
  xmlChar *pxVar1;
  xmlChar *local_20;
  xmlChar *ret;
  xmlChar *path_local;
  
  if (path == (xmlChar *)0x0) {
    path_local = (xmlChar *)0x0;
  }
  else {
    pxVar1 = xmlStrstr(path,"://");
    if (pxVar1 == (xmlChar *)0x0) {
      local_20 = xmlStrdup(path);
    }
    else {
      local_20 = xmlURIEscapeStr(path,(xmlChar *)":/?#[]@!$&()*+,;=\'%");
    }
    path_local = local_20;
  }
  return path_local;
}

Assistant:

xmlChar *
xmlCanonicPath(const xmlChar *path)
{
    xmlChar *ret;

    if (path == NULL)
	return(NULL);

    /* Check if this is an "absolute uri" */
    if (xmlStrstr(path, BAD_CAST "://") != NULL) {
	/*
         * Escape all characters except reserved, unreserved and the
         * percent sign.
         *
         * xmlURIEscapeStr already keeps unreserved characters, so we
         * pass gen-delims, sub-delims and "%" to ignore.
         */
        ret = xmlURIEscapeStr(path, BAD_CAST ":/?#[]@!$&()*+,;='%");
    } else {
        ret = xmlStrdup((const xmlChar *) path);
    }

    return(ret);
}